

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

void cpostfx(int pm)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  permonst *ptr_00;
  char *pcVar5;
  bool bVar6;
  char *local_150;
  int local_128;
  int local_124;
  int count;
  int i;
  permonst *ptr;
  char buf [256];
  int old_uen;
  boolean catch_lycanthropy;
  int tmp;
  int pm_local;
  
  old_uen = 0;
  buf[0xff] = '\0';
  if (eatmbuf != (char *)0x0) {
    eatmdone();
  }
  if (pm - 0x31U < 2) {
    if (u.acurr.a[1] < urace.attrmax[1]) {
      iVar2 = rn2(2);
      if (iVar2 == 0) {
        pline("Yum! That was real brain food!");
        adjattrib(1,1,'\0',0);
        goto LAB_001cd68a;
      }
    }
    else {
      pline("For some reason, that tasted bland.");
    }
LAB_001cd552:
    ptr_00 = mons + pm;
    bVar1 = dmgtype(ptr_00,0xc);
    if (((bVar1 != '\0') || (bVar1 = dmgtype(ptr_00,0x24), bVar1 != '\0')) || (pm == 0xa9)) {
      pline("Oh wow!  Great stuff!");
      make_hallucinated((ulong)(u.uprops[0x23].intrinsic + 200),'\0',0);
    }
    if ((mons[pm].mflags2 & 0x4000) != 0) {
      gainstr((obj *)0x0,0,'\0');
    }
    local_128 = 0;
    old_uen = 0;
    for (local_124 = 1; local_124 < 0x43; local_124 = local_124 + 1) {
      iVar2 = intrinsic_possible(local_124,ptr_00);
      if (iVar2 != 0) {
        local_128 = local_128 + 1;
        iVar2 = rn2(local_128);
        if (iVar2 == 0) {
          old_uen = local_124;
        }
      }
    }
    if (local_128 != 0) {
      givit(old_uen,ptr_00);
    }
    goto LAB_001cd68a;
  }
  if (pm != 0x41) {
    if (pm != 0x42) {
      if (pm != 0x43) {
        if (pm == 0x7a) {
LAB_001cd00a:
          make_stunned((ulong)(u.uprops[0x1b].intrinsic + 0x1e),'\0');
        }
        else if (pm != 0x82) {
          if (pm != 0x83) {
            if (pm != 0x9e) {
              if (pm == 0xd8) {
                pline("Your velocity suddenly seems very uncertain!");
                if ((u.uprops[0x1a].intrinsic & 0x7000000) == 0) {
                  u.uprops[0x1a].intrinsic = u.uprops[0x1a].intrinsic | 0x4000000;
                  pline("You seem faster.");
                }
                else {
                  u.uprops[0x1a].intrinsic = u.uprops[0x1a].intrinsic & 0xf8ffffff;
                  pline("You seem slower.");
                }
                goto LAB_001cd68a;
              }
              if (pm == 0xec) {
                pluslvl('\0');
                goto LAB_001cd68a;
              }
              if (pm == 0x10e) {
                buf[0xff] = '\x01';
                u.ulycn = 0x5d;
                goto LAB_001cd68a;
              }
              if (pm == 0x10f) {
                buf[0xff] = '\x01';
                u.ulycn = 0x11;
                goto LAB_001cd68a;
              }
              if (pm == 0x110) {
                buf[0xff] = '\x01';
                u.ulycn = 0x17;
                goto LAB_001cd68a;
              }
              if (pm != 0x117) {
                if (pm == 0x119) {
                  if (u.umonnum == u.umonster) {
                    u.uhp = u.uhpmax;
                  }
                  else {
                    u.mh = u.mhmax;
                  }
                  iflags.botl = '\x01';
                  goto LAB_001cd68a;
                }
                if (pm == 0x14f) {
                  iVar2 = rn2(3);
                  if ((iVar2 != 0) ||
                     (iVar2 = u.uen * 3,
                     iVar2 == u.uenmax * 2 ||
                     SBORROW4(iVar2,u.uenmax * 2) != iVar2 + u.uenmax * -2 < 0)) {
                    buf[0xf8] = (undefined1)u.uen;
                    buf[0xf9] = u.uen._1_1_;
                    buf[0xfa] = u.uen._2_1_;
                    buf[0xfb] = u.uen._3_1_;
                    iVar2 = rnd(3);
                    u.uen = iVar2 + u.uen;
                    if (u.uenmax < u.uen) {
                      iVar2 = rn2(3);
                      if (iVar2 == 0) {
                        u.uenmax = u.uenmax + 1;
                      }
                      u.uen = u.uenmax;
                    }
                    if (buf._248_4_ != u.uen) {
                      pline("You feel a mild buzz.");
                      iflags.botl = '\x01';
                    }
                  }
                  goto LAB_001cd68a;
                }
                if (pm == 0x154) {
                  if (2 < u.uprops[0x1b].intrinsic) {
                    make_stunned(2,'\0');
                  }
                  if (2 < u.uprops[0x1c].intrinsic) {
                    make_confused(2,'\0');
                  }
                  goto LAB_001cd68a;
                }
                if (pm != 0x155) goto LAB_001cd552;
              }
              if ((u.uprops[0x3d].intrinsic == 0) && (u.uprops[0x3d].extrinsic == 0)) {
                pline("You feel a change coming over you.");
                polyself('\0');
              }
              goto LAB_001cd68a;
            }
            if (((((u.uprops[0xd].intrinsic == 0) && (u.uprops[0xd].extrinsic == 0)) &&
                 (youmonst.data != mons + 0x9e)) && (youmonst.data != mons + 0x7b)) ||
               (u.uprops[0xd].blocked != 0)) {
              iVar2 = rn2(100);
              set_itimeout(&u.uprops[0xd].intrinsic,(long)(iVar2 + 0x32));
              if (((((u.uprops[0x1e].intrinsic == 0) &&
                    ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                   (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                  ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                 (u.uprops[0xd].blocked == 0)) {
                self_invis_message();
              }
            }
            else {
              if ((u.uprops[0xd].intrinsic & 0x7000000) == 0) {
                pline("You feel hidden!");
              }
              u.uprops[0xd].intrinsic = u.uprops[0xd].intrinsic | 0x4000000;
              u.uprops[0xc].intrinsic = u.uprops[0xc].intrinsic | 0x4000000;
            }
            newsym((int)u.ux,(int)u.uy);
          }
          goto LAB_001cd00a;
        }
        make_stunned((ulong)(u.uprops[0x1b].intrinsic + 0x1e),'\0');
        goto LAB_001cd68a;
      }
      old_uen = 10;
    }
    old_uen = old_uen + 0x14;
  }
  if ((((youmonst.data)->mlet != '\r') && (u.uprops[0x3d].intrinsic == 0)) &&
     (u.uprops[0x3d].extrinsic == 0)) {
    bVar6 = false;
    if (u.uprops[0x23].intrinsic != 0) {
      bVar6 = true;
      if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
        bVar1 = dmgtype(youmonst.data,0x24);
        bVar6 = bVar1 != '\0';
      }
      bVar6 = (bool)(bVar6 ^ 1);
    }
    pcVar5 = "a pile of gold";
    if (bVar6) {
      pcVar5 = "an orange";
    }
    pline("You can\'t resist the temptation to mimic %s.",pcVar5);
    if (u.usteed != (monst *)0x0) {
      dismount_steed(1);
    }
    nomul(-(old_uen + 0x14),"pretending to be a pile of gold");
    bVar6 = false;
    if (u.uprops[0x23].intrinsic != 0) {
      bVar6 = true;
      if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
        bVar1 = dmgtype(youmonst.data,0x24);
        bVar6 = bVar1 != '\0';
      }
      bVar6 = (bool)(bVar6 ^ 1);
    }
    pcVar5 = "You now prefer mimicking %s again.";
    if (bVar6) {
      pcVar5 = "You suddenly dread being peeled and mimic %s again!";
    }
    if (u.umonnum == u.umonster) {
      local_150 = urace.noun;
    }
    else {
      local_150 = mons_mname(youmonst.data);
    }
    pcVar3 = an(local_150);
    sprintf((char *)&ptr,pcVar5,pcVar3);
    sVar4 = strlen((char *)&ptr);
    pcVar5 = (char *)malloc(sVar4 + 1);
    nomovemsg = strcpy(pcVar5,(char *)&ptr);
    afternmv = eatmdone;
    youmonst.m_ap_type = '\x02';
    bVar6 = false;
    eatmbuf = nomovemsg;
    if (u.uprops[0x23].intrinsic != 0) {
      bVar6 = true;
      if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
        bVar1 = dmgtype(youmonst.data,0x24);
        bVar6 = bVar1 != '\0';
      }
      bVar6 = (bool)(bVar6 ^ 1);
    }
    youmonst.mappearance = 0x1ef;
    if (bVar6) {
      youmonst.mappearance = 0x117;
    }
    newsym((int)u.ux,(int)u.uy);
    flush_screen();
    (*windowprocs.win_pause)(P_MAP);
  }
LAB_001cd68a:
  if (((buf[0xff] != '\0') && (bVar1 = defends(0x1d,uwep), bVar1 != '\0')) &&
     (iVar2 = touch_artifact(uwep,&youmonst), iVar2 == 0)) {
    dropx(uwep);
    uwepgone();
  }
  return;
}

Assistant:

static void cpostfx(int pm)	/* called after completely consuming a corpse */
{
	int tmp = 0;
	boolean catch_lycanthropy = FALSE;

	/* in case `afternmv' didn't get called for previously mimicking
	   gold, clean up now to avoid `eatmbuf' memory leak */
	if (eatmbuf) eatmdone();

	switch(pm) {
	    case PM_NEWT:
		/* MRKR: "eye of newt" may give small magical energy boost */
		if (rn2(3) || 3 * u.uen <= 2 * u.uenmax) {
		    int old_uen = u.uen;
		    u.uen += rnd(3);
		    if (u.uen > u.uenmax) {
			if (!rn2(3)) u.uenmax++;
			u.uen = u.uenmax;
		    }
		    if (old_uen != u.uen) {
			    pline("You feel a mild buzz.");
			    iflags.botl = 1;
		    }
		}
		break;
	    case PM_WRAITH:
		pluslvl(FALSE);
		break;
	    case PM_HUMAN_WERERAT:
		catch_lycanthropy = TRUE;
		u.ulycn = PM_WERERAT;
		break;
	    case PM_HUMAN_WEREJACKAL:
		catch_lycanthropy = TRUE;
		u.ulycn = PM_WEREJACKAL;
		break;
	    case PM_HUMAN_WEREWOLF:
		catch_lycanthropy = TRUE;
		u.ulycn = PM_WEREWOLF;
		break;
	    case PM_NURSE:
		if (Upolyd) u.mh = u.mhmax;
		else u.uhp = u.uhpmax;
		iflags.botl = 1;
		break;
	    case PM_STALKER:
		if (!Invis) {
			set_itimeout(&HInvis, (long)rn1(100, 50));
			if (!Blind && !BInvis) self_invis_message();
		} else {
			if (!(HInvis & INTRINSIC)) pline("You feel hidden!");
			HInvis |= FROMOUTSIDE;
			HSee_invisible |= FROMOUTSIDE;
		}
		newsym(u.ux, u.uy);
		/* fall into next case */
	    case PM_YELLOW_LIGHT:
		/* fall into next case */
	    case PM_GIANT_BAT:
		make_stunned(HStun + 30,FALSE);
		/* fall into next case */
	    case PM_BAT:
		make_stunned(HStun + 30,FALSE);
		break;
	    case PM_GIANT_MIMIC:
		tmp += 10;
		/* fall into next case */
	    case PM_LARGE_MIMIC:
		tmp += 20;
		/* fall into next case */
	    case PM_SMALL_MIMIC:
		tmp += 20;
		if (youmonst.data->mlet != S_MIMIC && !Unchanging) {
		    char buf[BUFSZ];
		    pline("You can't resist the temptation to mimic %s.",
			Hallucination ? "an orange" : "a pile of gold");
                    /* A pile of gold can't ride. */
		    if (u.usteed) dismount_steed(DISMOUNT_FELL);
		    nomul(-tmp, "pretending to be a pile of gold");
		    sprintf(buf, Hallucination ?
			"You suddenly dread being peeled and mimic %s again!" :
			"You now prefer mimicking %s again.",
			an(Upolyd ? mons_mname(youmonst.data) : urace.noun));
		    eatmbuf = strcpy(malloc(strlen(buf) + 1), buf);
		    nomovemsg = eatmbuf;
		    afternmv = eatmdone;
		    /* ??? what if this was set before? */
		    youmonst.m_ap_type = M_AP_OBJECT;
		    youmonst.mappearance = Hallucination ? ORANGE : GOLD_PIECE;
		    newsym(u.ux,u.uy);
		    flush_screen();
		    /* make gold symbol show up now */
		    win_pause_output(P_MAP);
		}
		break;
	    case PM_QUANTUM_MECHANIC:
		pline("Your velocity suddenly seems very uncertain!");
		if (HFast & INTRINSIC) {
			HFast &= ~INTRINSIC;
			pline("You seem slower.");
		} else {
			HFast |= FROMOUTSIDE;
			pline("You seem faster.");
		}
		break;
	    case PM_LIZARD:
		if (HStun > 2)  make_stunned(2L,FALSE);
		if (HConfusion > 2)  make_confused(2L,FALSE);
		break;
	    case PM_CHAMELEON:
	    case PM_DOPPELGANGER:
	 /* case PM_SANDESTIN: */
		if (!Unchanging) {
		    pline("You feel a change coming over you.");
		    polyself(FALSE);
		}
		break;
	    case PM_MIND_FLAYER:
	    case PM_MASTER_MIND_FLAYER:
		if (ABASE(A_INT) < ATTRMAX(A_INT)) {
			if (!rn2(2)) {
				pline("Yum! That was real brain food!");
				adjattrib(A_INT, 1, FALSE, 0);
				break;	/* don't give them telepathy, too */
			}
		}
		else {
			pline("For some reason, that tasted bland.");
		}
		/* fall through to default case */
	    default: {
		const struct permonst *ptr = &mons[pm];
		int i, count;

		if (dmgtype(ptr, AD_STUN) || dmgtype(ptr, AD_HALU) ||
		    pm == PM_VIOLET_FUNGUS) {
			pline ("Oh wow!  Great stuff!");
			make_hallucinated(HHallucination + 200,FALSE,0L);
		}
		if (is_giant(ptr)) gainstr(NULL, 0, FALSE);

		/* Check the monster for all of the intrinsics.  If this
		 * monster can give more than one, pick one to try to give
		 * from among all it can give.
		 *
		 * If a monster can give 4 intrinsics then you have
		 * a 1/1 * 1/2 * 2/3 * 3/4 = 1/4 chance of getting the first,
		 * a 1/2 * 2/3 * 3/4 = 1/4 chance of getting the second,
		 * a 1/3 * 3/4 = 1/4 chance of getting the third,
		 * and a 1/4 chance of getting the fourth.
		 *
		 * And now a proof by induction:
		 * it works for 1 intrinsic (1 in 1 of getting it)
		 * for 2 you have a 1 in 2 chance of getting the second,
		 *	otherwise you keep the first
		 * for 3 you have a 1 in 3 chance of getting the third,
		 *	otherwise you keep the first or the second
		 * for n+1 you have a 1 in n+1 chance of getting the (n+1)st,
		 *	otherwise you keep the previous one.
		 * Elliott Kleinrock, October 5, 1990
		 */

		 count = 0;	/* number of possible intrinsics */
		 tmp = 0;	/* which one we will try to give */
		 for (i = 1; i <= LAST_PROP; i++) {
			if (intrinsic_possible(i, ptr)) {
				count++;
				/* a 1 in count chance of replacing the old
				 * one with this one, and a count-1 in count
				 * chance of keeping the old one.  (note
				 * that 1 in 1 and 0 in 1 are what we want
				 * for the first one
				 */
				if (!rn2(count))
					tmp = i;
			}
		 }

		 /* if any found try to give them one */
		 if (count) givit(tmp, ptr);
	    }
	    break;
	}

	if (catch_lycanthropy && defends(AD_WERE, uwep)) {
	    if (!touch_artifact(uwep, &youmonst)) {
		dropx(uwep);
		uwepgone();
	    }
	}

	return;
}